

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue json_parse_value(JSParseState *s)

{
  JSContext *ctx;
  JSShape *sh;
  JSAtomStruct *pJVar1;
  uint uVar2;
  int iVar3;
  JSAtom v;
  int iVar4;
  JSValueUnion JVar5;
  JSRefCountHeader *p;
  JSValueUnion JVar6;
  ulong uVar7;
  int64_t iVar8;
  ulong uVar9;
  JSValue this_obj;
  JSValue JVar10;
  JSValue JVar11;
  JSValue prop;
  
  ctx = s->ctx;
  iVar3 = (s->token).val;
  if (iVar3 < -0x56) {
    if (iVar3 == -0x80) {
      JVar6 = (JSValueUnion)*(JSValueUnion *)&(s->token).u;
      iVar8 = (s->token).u.str.str.tag;
LAB_0012c6eb:
      this_obj.tag = iVar8;
      this_obj.u.ptr = JVar6.ptr;
      uVar9 = (ulong)JVar6.ptr >> 0x20;
      iVar3 = json_next_token(s);
    }
    else {
      if (iVar3 == -0x7f) {
        JVar6 = (JSValueUnion)*(JSValueUnion *)&(s->token).u;
        iVar8 = (s->token).u.str.str.tag;
        if (0xfffffff4 < (uint)iVar8) {
          *(int *)JVar6.ptr = *JVar6.ptr + 1;
        }
        goto LAB_0012c6eb;
      }
      if ((iVar3 != -0x7d) || (uVar2 = (s->token).u.ident.atom - 1, 2 < uVar2)) {
LAB_0012c691:
        js_parse_error(s,"unexpected token: \'%.*s\'",
                       (ulong)(uint)(*(int *)&s->buf_ptr - (int)(s->token).ptr));
        goto LAB_0012c745;
      }
      this_obj.u._4_4_ = 0;
      this_obj.u.int32 = *(uint *)(&DAT_00179c98 + (ulong)uVar2 * 4);
      this_obj.tag = *(int64_t *)(&DAT_00179c80 + (ulong)uVar2 * 8);
      iVar3 = json_next_token(s);
      uVar9 = 0;
    }
LAB_0012c6fa:
    if (iVar3 == 0) {
LAB_0012c7b1:
      iVar8 = this_obj.tag;
      uVar9 = uVar9 << 0x20;
      uVar7 = (ulong)this_obj.u.ptr & 0xffffffff;
      goto LAB_0012c748;
    }
LAB_0012c702:
    if (0xfffffff4 < (uint)this_obj.tag) {
      JVar11.u.ptr = (void *)((ulong)this_obj.u.ptr & 0xffffffff | uVar9 << 0x20);
      iVar3 = *JVar11.u.ptr;
      *(int *)JVar11.u.ptr = iVar3 + -1;
      if (iVar3 < 2) {
        JVar11.tag = this_obj.tag;
        __JS_FreeValueRT(ctx->rt,JVar11);
      }
    }
  }
  else if (iVar3 == -0x56) {
    js_parse_error(s,"unexpected end of input");
  }
  else {
    if (iVar3 == 0x5b) {
      iVar3 = json_next_token(s);
      if (iVar3 != 0) goto LAB_0012c745;
      sh = ctx->array_shape;
      (sh->header).ref_count = (sh->header).ref_count + 1;
      this_obj = JS_NewObjectFromShape(ctx,sh,2);
      uVar9 = (ulong)this_obj.u.ptr >> 0x20;
      if ((int)this_obj.tag != 6) {
        if ((s->token).val != 0x5d) {
          JVar11 = json_parse_value(s);
          if ((int)JVar11.tag != 6) {
            JVar6.float64 = 0.0;
            do {
              iVar3 = JVar6.int32;
              JVar5.float64 = (double)JVar6.float64;
              if (-1 < iVar3) {
                JVar5 = JVar6;
              }
              iVar8 = 7;
              if (-1 < iVar3) {
                iVar8 = 0;
              }
              prop.tag = iVar8;
              prop.u.float64 = JVar5.float64;
              iVar4 = JS_DefinePropertyValueValue(ctx,this_obj,prop,JVar11,7);
              if (iVar4 < 0) break;
              if ((s->token).val != 0x2c) goto LAB_0012c799;
              iVar4 = json_next_token(s);
              if (iVar4 != 0) break;
              if ((s->ext_json != 0) && ((s->token).val == 0x5d)) goto LAB_0012c799;
              JVar11 = json_parse_value(s);
              JVar6._0_4_ = iVar3 + 1;
              JVar6._4_4_ = 0;
            } while ((int)JVar11.tag != 6);
          }
          goto LAB_0012c702;
        }
LAB_0012c799:
        iVar3 = json_parse_expect(s,0x5d);
        if (iVar3 != 0) goto LAB_0012c702;
        goto LAB_0012c7b1;
      }
      goto LAB_0012c702;
    }
    if (iVar3 != 0x7b) goto LAB_0012c691;
    iVar3 = json_next_token(s);
    if (iVar3 == 0) {
      this_obj = JS_NewObjectProtoClass(ctx,ctx->class_proto[1],1);
      uVar9 = (ulong)this_obj.u.ptr >> 0x20;
      if ((int)this_obj.tag != 6) {
        iVar3 = (s->token).val;
        if (iVar3 != 0x7d) {
          do {
            if (iVar3 == -0x7f) {
              v = JS_ValueToAtom(ctx,(s->token).u.str.str);
              if (v == 0) goto LAB_0012c702;
            }
            else {
              if ((iVar3 != -0x7d) || (s->ext_json == 0)) {
                js_parse_error(s,"expecting property name");
                goto LAB_0012c702;
              }
              v = (s->token).u.ident.atom;
              if (0xd1 < (long)(int)v) {
                pJVar1 = ctx->rt->atom_array[(int)v];
                (pJVar1->header).ref_count = (pJVar1->header).ref_count + 1;
              }
            }
            iVar3 = json_next_token(s);
            if (((iVar3 != 0) || (iVar3 = json_parse_expect(s,0x3a), iVar3 != 0)) ||
               (JVar11 = json_parse_value(s), (int)JVar11.tag == 6)) {
              JS_FreeAtom(ctx,v);
              goto LAB_0012c702;
            }
            iVar3 = JS_DefinePropertyValue(ctx,this_obj,v,JVar11,7);
            JS_FreeAtom(ctx,v);
            if (iVar3 < 0) goto LAB_0012c702;
            if ((s->token).val != 0x2c) break;
            iVar3 = json_next_token(s);
            if (iVar3 != 0) goto LAB_0012c702;
            iVar3 = (s->token).val;
          } while (iVar3 != 0x7d || s->ext_json == 0);
        }
        iVar3 = json_parse_expect(s,0x7d);
        goto LAB_0012c6fa;
      }
      goto LAB_0012c702;
    }
  }
LAB_0012c745:
  uVar7 = 0;
  iVar8 = 6;
  uVar9 = 0;
LAB_0012c748:
  JVar10.tag = iVar8;
  JVar10.u.ptr = (void *)(uVar7 | uVar9);
  return JVar10;
}

Assistant:

static JSValue json_parse_value(JSParseState *s)
{
    JSContext *ctx = s->ctx;
    JSValue val = JS_NULL;
    int ret;

    switch(s->token.val) {
    case '{':
        {
            JSValue prop_val;
            JSAtom prop_name;
            
            if (json_next_token(s))
                goto fail;
            val = JS_NewObject(ctx);
            if (JS_IsException(val))
                goto fail;
            if (s->token.val != '}') {
                for(;;) {
                    if (s->token.val == TOK_STRING) {
                        prop_name = JS_ValueToAtom(ctx, s->token.u.str.str);
                        if (prop_name == JS_ATOM_NULL)
                            goto fail;
                    } else if (s->ext_json && s->token.val == TOK_IDENT) {
                        prop_name = JS_DupAtom(ctx, s->token.u.ident.atom);
                    } else {
                        js_parse_error(s, "expecting property name");
                        goto fail;
                    }
                    if (json_next_token(s))
                        goto fail1;
                    if (json_parse_expect(s, ':'))
                        goto fail1;
                    prop_val = json_parse_value(s);
                    if (JS_IsException(prop_val)) {
                    fail1:
                        JS_FreeAtom(ctx, prop_name);
                        goto fail;
                    }
                    ret = JS_DefinePropertyValue(ctx, val, prop_name,
                                                 prop_val, JS_PROP_C_W_E);
                    JS_FreeAtom(ctx, prop_name);
                    if (ret < 0)
                        goto fail;

                    if (s->token.val != ',')
                        break;
                    if (json_next_token(s))
                        goto fail;
                    if (s->ext_json && s->token.val == '}')
                        break;
                }
            }
            if (json_parse_expect(s, '}'))
                goto fail;
        }
        break;
    case '[':
        {
            JSValue el;
            uint32_t idx;

            if (json_next_token(s))
                goto fail;
            val = JS_NewArray(ctx);
            if (JS_IsException(val))
                goto fail;
            if (s->token.val != ']') {
                idx = 0;
                for(;;) {
                    el = json_parse_value(s);
                    if (JS_IsException(el))
                        goto fail;
                    ret = JS_DefinePropertyValueUint32(ctx, val, idx, el, JS_PROP_C_W_E);
                    if (ret < 0)
                        goto fail;
                    if (s->token.val != ',')
                        break;
                    if (json_next_token(s))
                        goto fail;
                    idx++;
                    if (s->ext_json && s->token.val == ']')
                        break;
                }
            }
            if (json_parse_expect(s, ']'))
                goto fail;
        }
        break;
    case TOK_STRING:
        val = JS_DupValue(ctx, s->token.u.str.str);
        if (json_next_token(s))
            goto fail;
        break;
    case TOK_NUMBER:
        val = s->token.u.num.val;
        if (json_next_token(s))
            goto fail;
        break;
    case TOK_IDENT:
        if (s->token.u.ident.atom == JS_ATOM_false ||
            s->token.u.ident.atom == JS_ATOM_true) {
            val = JS_NewBool(ctx, (s->token.u.ident.atom == JS_ATOM_true));
        } else if (s->token.u.ident.atom == JS_ATOM_null) {
            val = JS_NULL;
        } else {
            goto def_token;
        }
        if (json_next_token(s))
            goto fail;
        break;
    default:
    def_token:
        if (s->token.val == TOK_EOF) {
            js_parse_error(s, "unexpected end of input");
        } else {
            js_parse_error(s, "unexpected token: '%.*s'",
                           (int)(s->buf_ptr - s->token.ptr), s->token.ptr);
        }
        goto fail;
    }
    return val;
 fail:
    JS_FreeValue(ctx, val);
    return JS_EXCEPTION;
}